

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O3

float * __thiscall
sisl::cartesian_cubic<float>::operator()(cartesian_cubic<float> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  float *pfVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = vl->gp_offset;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    vl->gp_offset = (uint)(uVar5 + 8);
    uVar4 = *(uint *)((long)vl->reg_save_area + uVar5);
    if (uVar1 < 0x21) {
      puVar3 = (uint *)(uVar5 + 8 + (long)vl->reg_save_area);
      vl->gp_offset = uVar1 + 0x10;
      goto LAB_001441b0;
    }
  }
  else {
    puVar3 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar3 + 2;
    uVar4 = *puVar3;
  }
  puVar3 = (uint *)vl->overflow_arg_area;
  vl->overflow_arg_area = puVar3 + 2;
LAB_001441b0:
  uVar1 = *puVar3;
  this->__zero = 0.0;
  if ((((-1 < d0) && ((uint)d0 <= this->_nx)) && (-1 < (int)uVar4)) &&
     (((uVar4 <= this->_ny && (-1 < (int)uVar1)) && (uVar1 <= this->_nz)))) {
    pfVar2 = array_n<float,_3,_std::allocator<float>_>::operator()(&this->_array,d0);
    return pfVar2;
  }
  return &this->__zero;
}

Assistant:

virtual T& operator()(int d0, va_list vl) {
            unsigned int _x = d0, _y = 0, _z = 0;
            _y = va_arg(vl, unsigned int);
            _z = va_arg(vl, unsigned int);

            __zero = 0;

            if(!in_bound(_x, _y, _z)) return __zero;
            return _array(_x, _y, _z);
        }